

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<char[30],std::__cxx11::string,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char (*args) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,long *args_2)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<char[30],std::__cxx11::string,long>
            ((ostream *)local_1b0,(char *)this,(char (*) [30])fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (long *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}